

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.hpp
# Opt level: O0

void __thiscall helics::Interface::~Interface(Interface *this)

{
  code *pcVar1;
  Interface *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~Interface() = default;